

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack15_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [32];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  
  auVar1 = *(undefined1 (*) [32])in;
  auVar9 = vpmovsxbd_avx512f(_DAT_0018af90);
  auVar8._8_8_ = *(undefined8 *)(in + 6);
  auVar8._0_8_ = *(undefined8 *)(in + 6);
  auVar10 = vpmovsxbd_avx512f(_DAT_00197280);
  auVar11 = vpbroadcastd_avx512f(ZEXT416(0x7fff));
  uVar2 = in[0xb];
  auVar8 = vpsllvd_avx2(auVar8,_DAT_00197210);
  auVar5._8_8_ = 0x400000007000;
  auVar5._0_8_ = 0x400000007000;
  auVar6 = vpandq_avx512vl(auVar8,auVar5);
  *out = *in & 0x7fff;
  auVar9 = vpermd_avx512f(auVar9,ZEXT3264(auVar1));
  auVar8 = *(undefined1 (*) [16])(in + 4);
  auVar9 = vpsrlvd_avx512f(auVar9,_DAT_001a68c0);
  auVar5 = vpalignr_avx(auVar8,*(undefined1 (*) [16])in,4);
  auVar5 = vpsllvd_avx2(auVar5,_DAT_001971f0);
  auVar5 = vpand_avx(auVar5,_DAT_00197200);
  auVar1 = vpermq_avx2(ZEXT1632(auVar5),0xd8);
  auVar1 = vpshufd_avx2(auVar1,0x50);
  auVar12 = vpbroadcastd_avx512f();
  uVar4 = *(ulong *)(in + 8);
  uVar3 = in[10];
  auVar10 = vpermi2d_avx512f(auVar10,ZEXT4064(CONCAT436(auVar12._36_4_,CONCAT432(0,auVar1))),
                             ZEXT1664(auVar6));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x1000007));
  auVar12 = vpandd_avx512f(auVar9,auVar11);
  auVar9 = vpord_avx512f(auVar9,auVar10);
  auVar10._4_4_ = auVar9._4_4_;
  auVar10._0_4_ = auVar12._0_4_;
  auVar10._8_4_ = auVar12._8_4_;
  auVar10._12_4_ = auVar9._12_4_;
  auVar10._16_4_ = auVar12._16_4_;
  auVar10._20_4_ = auVar9._20_4_;
  auVar10._24_4_ = auVar12._24_4_;
  auVar10._28_4_ = auVar9._28_4_;
  auVar10._32_4_ = auVar12._32_4_;
  auVar10._36_4_ = auVar9._36_4_;
  auVar10._40_4_ = auVar12._40_4_;
  auVar10._44_4_ = auVar9._44_4_;
  auVar10._48_4_ = auVar12._48_4_;
  auVar10._52_4_ = auVar9._52_4_;
  auVar10._56_4_ = auVar12._56_4_;
  auVar10._60_4_ = auVar12._60_4_;
  auVar9 = vmovdqu64_avx512f(auVar10);
  *(undefined1 (*) [64])(out + 1) = auVar9;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar4;
  auVar6 = vpsllvd_avx2(auVar13,_DAT_001a4280);
  auVar7._8_8_ = 0x7ff800007ffe;
  auVar7._0_8_ = 0x7ff800007ffe;
  auVar7 = vpandq_avx512vl(auVar6,auVar7);
  auVar8 = vpermi2d_avx512vl(auVar5,auVar13,auVar8);
  auVar6 = vpsrlvd_avx2(auVar8,_DAT_001a44c0);
  auVar8 = vpmovzxdq_avx(auVar7);
  auVar5 = vpor_avx(auVar6,auVar8);
  auVar8 = vpand_avx(auVar6,auVar11._0_16_);
  auVar8 = vpblendd_avx2(auVar5,auVar8,10);
  *(undefined1 (*) [16])(out + 0x11) = auVar8;
  out[0x15] = (uint)(uVar4 >> 0x3b) | (uVar3 & 0x3ff) << 5;
  out[0x16] = uVar3 >> 10 & 0x7fff;
  out[0x17] = (uVar2 & 0xff) << 7 | uVar3 >> 0x19;
  return in + 0xc;
}

Assistant:

const uint32_t *__fastunpack15_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 15);
  out++;
  *out = ((*in) >> 15) % (1U << 15);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 13)) << (15 - 13);
  out++;
  *out = ((*in) >> 13) % (1U << 15);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 11)) << (15 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 15);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 9)) << (15 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 15);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 7)) << (15 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 15);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 5)) << (15 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 15);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 3)) << (15 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 15);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 1)) << (15 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 15);
  out++;
  *out = ((*in) >> 16) % (1U << 15);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 14)) << (15 - 14);
  out++;
  *out = ((*in) >> 14) % (1U << 15);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 12)) << (15 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 15);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 10)) << (15 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 15);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 8)) << (15 - 8);
  out++;

  return in + 1;
}